

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

void __thiscall
TArray<FStatistics,_FStatistics>::DoDelete
          (TArray<FStatistics,_FStatistics> *this,uint first,uint last)

{
  long lVar1;
  ulong uVar2;
  
  if (last != 0xffffffff) {
    uVar2 = (ulong)first;
    lVar1 = uVar2 << 5;
    for (; uVar2 <= last; uVar2 = uVar2 + 1) {
      FStatistics::~FStatistics((FStatistics *)((long)&(this->Array->stats).Array + lVar1));
      lVar1 = lVar1 + 0x20;
    }
    return;
  }
  __assert_fail("last != ~0u",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/tarray.h"
                ,0x1b2,
                "void TArray<FStatistics>::DoDelete(unsigned int, unsigned int) [T = FStatistics, TT = FStatistics]"
               );
}

Assistant:

void DoDelete (unsigned int first, unsigned int last)
	{
		assert (last != ~0u);
		for (unsigned int i = first; i <= last; ++i)
		{
			Array[i].~T();
		}
	}